

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithru.c
# Opt level: O3

void initialize(void)

{
  uint id;
  PmError PVar1;
  PmDeviceInfo *pPVar2;
  undefined8 extraout_RAX;
  int iVar3;
  char *__format;
  undefined8 uStackY_30;
  ulong uStackY_28;
  
  in_queue = Pm_QueueCreate(0x400,8);
  if (in_queue == (PmQueue *)0x0) {
    __assert_fail("in_queue != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                  ,0xfd,"void initialize()");
  }
  out_queue = Pm_QueueCreate(0x400,8);
  if (out_queue != (PmQueue *)0x0) {
    Pt_Start(1,process_midi,(void *)0x0);
    Pm_Initialize();
    id = Pm_GetDefaultOutputDeviceID();
    pPVar2 = Pm_GetDeviceInfo(id);
    if (pPVar2 == (PmDeviceInfo *)0x0) {
      __format = "Could not open default output device (%d).";
    }
    else {
      printf("Opening output device %s %s\n",pPVar2->interf,pPVar2->name);
      Pm_OpenOutput(&midi_out,id,(void *)0x0,0x400,midithru_time_proc,(void *)0x0,0);
      id = Pm_GetDefaultInputDeviceID();
      pPVar2 = Pm_GetDeviceInfo(id);
      if (pPVar2 != (PmDeviceInfo *)0x0) {
        printf("Opening input device %s %s\n",pPVar2->interf,pPVar2->name);
        Pm_OpenInput(&midi_in,id,(void *)0x0,0,midithru_time_proc,(void *)0x0);
        Pm_SetFilter(midi_in,0x4100);
        active = 1;
        return;
      }
      __format = "Could not open default input device (%d).";
    }
    printf(__format,(ulong)id);
    exit_with_message("");
    uStackY_30 = extraout_RAX;
    uStackY_28 = (ulong)id;
    puts("begin PortMidi midithru program...");
    initialize();
    printf("%s\n%s\n","This program will run for 60 seconds, or until you play middle C,",
           "echoing all input with a 2 second delay.");
    if (499 < current_timestamp) {
      iVar3 = 500;
      do {
        while( true ) {
          PVar1 = Pm_Dequeue(in_queue,&uStackY_30);
          if (PVar1 != pmGotData) break;
          uStackY_30 = CONCAT44(uStackY_30._4_4_ + 2000,(undefined4)uStackY_30);
          Pm_Enqueue(out_queue,&uStackY_30);
        }
        iVar3 = iVar3 + 500;
      } while (iVar3 <= current_timestamp);
    }
    do {
    } while( true );
  }
  __assert_fail("out_queue != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                ,0xff,"void initialize()");
}

Assistant:

void initialize()
/* set up midi processing thread and open midi streams */
{
    /* note that it is safe to call PortMidi from the main thread for
       initialization and opening devices. You should not make any
       calls to PortMidi from this thread once the midi thread begins.
       to make PortMidi calls.
     */

    /* note that this routine provides minimal error checking. If
       you use the PortMidi library compiled with PM_CHECK_ERRORS,
       then error messages will be printed and the program will exit
       if an error is encountered. Otherwise, you should add some
       error checking to this code.
     */

    const PmDeviceInfo *info;
    int id;

    /* make the message queues */
    in_queue = Pm_QueueCreate(IN_QUEUE_SIZE, sizeof(PmEvent));
    assert(in_queue != NULL);
    out_queue = Pm_QueueCreate(OUT_QUEUE_SIZE, sizeof(PmEvent));
    assert(out_queue != NULL);

    /* always start the timer before you start midi */
    Pt_Start(1, &process_midi, 0); /* start a timer with millisecond accuracy */
    /* the timer will call our function, process_midi() every millisecond */
    
    Pm_Initialize();

    id = Pm_GetDefaultOutputDeviceID();
    info = Pm_GetDeviceInfo(id);
    if (info == NULL) {
        printf("Could not open default output device (%d).", id);
        exit_with_message("");
    }
    printf("Opening output device %s %s\n", info->interf, info->name);

    /* use zero latency because we want output to be immediate */
    Pm_OpenOutput(&midi_out, 
                  id, 
                  NULL /* driver info */,
                  OUT_QUEUE_SIZE,
                  &midithru_time_proc,
                  NULL /* time info */,
                  0 /* Latency */);

    id = Pm_GetDefaultInputDeviceID();
    info = Pm_GetDeviceInfo(id);
    if (info == NULL) {
        printf("Could not open default input device (%d).", id);
        exit_with_message("");
    }
    printf("Opening input device %s %s\n", info->interf, info->name);
    Pm_OpenInput(&midi_in, 
                 id, 
                 NULL /* driver info */,
                 0 /* use default input size */,
                 &midithru_time_proc,
                 NULL /* time info */);
    /* Note: if you set a filter here, then this will filter what goes
       to the MIDI THRU port. You may not want to do this.
     */
    Pm_SetFilter(midi_in, PM_FILT_ACTIVE | PM_FILT_CLOCK);

    active = TRUE; /* enable processing in the midi thread -- yes, this
                      is a shared variable without synchronization, but
                      this simple assignment is safe */

}